

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

int __thiscall
tcu::ConstPixelBufferAccess::getPixStencil(ConstPixelBufferAccess *this,int x,int y,int z)

{
  ChannelType type;
  int iVar1;
  byte *value;
  
  value = (byte *)((long)this->m_data +
                  (long)(z * (this->m_pitch).m_data[2]) + (long)(y * (this->m_pitch).m_data[1]) +
                  (long)(x * (this->m_pitch).m_data[0]));
  type = (this->m_format).type;
  if (type - UNSIGNED_INT_16_8_8 < 2) {
    return (int)*value;
  }
  if (type != FLOAT_UNSIGNED_INT_24_8_REV) {
    if (type == UNSIGNED_INT_24_8_REV) {
      return (int)value[3];
    }
    iVar1 = anon_unknown_74::channelToInt(value,type);
    return iVar1;
  }
  return (int)value[4];
}

Assistant:

int ConstPixelBufferAccess::getPixStencil (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	const deUint8* const pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32High8(pixelPtr);

		case TextureFormat::UNSIGNED_INT_16_8_8:
		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32Low8(pixelPtr);

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32Low8(pixelPtr + 4);

		default:
		{
			DE_ASSERT(m_format.order == TextureFormat::S); // no other combined depth stencil types
			return channelToInt(pixelPtr, m_format.type);
		}
	}
}